

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

void __thiscall
wasm::WATParser::ParseTypeDefsCtx::ParseTypeDefsCtx
          (ParseTypeDefsCtx *this,Lexer *in,TypeBuilder *builder,IndexMap *typeIndices)

{
  size_t __n;
  allocator<wasm::TypeNames> local_35 [13];
  IndexMap *local_28;
  IndexMap *typeIndices_local;
  TypeBuilder *builder_local;
  Lexer *in_local;
  ParseTypeDefsCtx *this_local;
  
  local_28 = typeIndices;
  typeIndices_local = (IndexMap *)builder;
  builder_local = (TypeBuilder *)in;
  in_local = (Lexer *)this;
  TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::TypeParserCtx
            (&this->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,typeIndices);
  Lexer::Lexer(&this->in,(Lexer *)builder_local);
  this->builder = (TypeBuilder *)typeIndices_local;
  __n = TypeBuilder::size((TypeBuilder *)typeIndices_local);
  std::allocator<wasm::TypeNames>::allocator(local_35);
  std::vector<wasm::TypeNames,_std::allocator<wasm::TypeNames>_>::vector(&this->names,__n,local_35);
  std::allocator<wasm::TypeNames>::~allocator(local_35);
  this->index = 0;
  return;
}

Assistant:

ParseTypeDefsCtx(Lexer& in, TypeBuilder& builder, const IndexMap& typeIndices)
    : TypeParserCtx<ParseTypeDefsCtx>(typeIndices), in(in), builder(builder),
      names(builder.size()) {}